

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::execute_rotate(int *argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  bool local_609;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  double local_480;
  double theta_z;
  string local_470;
  double local_450;
  double theta_y;
  string local_440;
  double local_420;
  double theta_x;
  string local_410;
  double local_3f0;
  double ori_z;
  string local_3e0;
  double local_3c0;
  double ori_y;
  string local_3b0;
  double local_390;
  double ori_x;
  string local_380;
  byte local_35b;
  byte local_35a;
  allocator<char> local_359;
  string local_358;
  byte local_333;
  byte local_332;
  allocator<char> local_331;
  string local_330;
  byte local_30b;
  byte local_30a;
  allocator<char> local_309;
  string local_308;
  byte local_2e3;
  byte local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  undefined1 local_298 [8];
  geofile primary_geofile;
  undefined1 local_98 [8];
  string outfile_path;
  string local_70 [8];
  string input_path;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **argv_local;
  int *argc_local;
  
  local_18 = argv;
  argv_local = (char **)argc;
  if (*argc == 0xb) {
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,pcVar1,(allocator<char> *)(outfile_path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(outfile_path.field_2._M_local_buf + 0xf));
    pcVar1 = local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,pcVar1,
               (allocator<char> *)
               ((long)&primary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&primary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    GEO::geofile::geofile((geofile *)local_298);
    pcVar1 = local_18[5];
    std::allocator<char>::allocator();
    local_2e2 = 0;
    local_2e3 = 0;
    local_30a = 0;
    local_30b = 0;
    local_332 = 0;
    local_333 = 0;
    local_35a = 0;
    local_35b = 0;
    ori_x._6_1_ = 0;
    ori_x._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar1,&local_2b9);
    bVar2 = GEO::is_e_notation(&local_2b8);
    local_609 = false;
    if (bVar2) {
      pcVar1 = local_18[6];
      std::allocator<char>::allocator();
      local_2e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,pcVar1,&local_2e1);
      local_2e3 = 1;
      bVar2 = GEO::is_e_notation(&local_2e0);
      local_609 = false;
      if (bVar2) {
        pcVar1 = local_18[7];
        std::allocator<char>::allocator();
        local_30a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,pcVar1,&local_309);
        local_30b = 1;
        bVar2 = GEO::is_e_notation(&local_308);
        local_609 = false;
        if (bVar2) {
          pcVar1 = local_18[8];
          std::allocator<char>::allocator();
          local_332 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,pcVar1,&local_331)
          ;
          local_333 = 1;
          bVar2 = GEO::is_e_notation(&local_330);
          local_609 = false;
          if (bVar2) {
            pcVar1 = local_18[9];
            std::allocator<char>::allocator();
            local_35a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_358,pcVar1,&local_359);
            local_35b = 1;
            bVar2 = GEO::is_e_notation(&local_358);
            local_609 = false;
            if (bVar2) {
              pcVar1 = local_18[10];
              std::allocator<char>::allocator();
              ori_x._6_1_ = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_380,pcVar1,(allocator<char> *)((long)&ori_x + 7));
              ori_x._5_1_ = 1;
              local_609 = GEO::is_e_notation(&local_380);
            }
          }
        }
      }
    }
    if ((ori_x._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_380);
    }
    if ((ori_x._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&ori_x + 7));
    }
    if ((local_35b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_358);
    }
    if ((local_35a & 1) != 0) {
      std::allocator<char>::~allocator(&local_359);
    }
    if ((local_333 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_330);
    }
    if ((local_332 & 1) != 0) {
      std::allocator<char>::~allocator(&local_331);
    }
    if ((local_30b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_308);
    }
    if ((local_30a & 1) != 0) {
      std::allocator<char>::~allocator(&local_309);
    }
    if ((local_2e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    if ((local_2e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2e1);
    }
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    if (local_609 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"Error: Shifting parameters unrecognized. Terminating.",
                 &local_5c9);
      print_ln(&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator(&local_5c9);
    }
    else {
      pcVar1 = local_18[5];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,pcVar1,(allocator<char> *)((long)&ori_y + 7));
      dVar4 = std::__cxx11::stod(&local_3b0,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ori_y + 7));
      pcVar1 = local_18[6];
      local_390 = dVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,pcVar1,(allocator<char> *)((long)&ori_z + 7));
      dVar4 = std::__cxx11::stod(&local_3e0,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ori_z + 7));
      pcVar1 = local_18[7];
      local_3c0 = dVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,pcVar1,(allocator<char> *)((long)&theta_x + 7));
      dVar4 = std::__cxx11::stod(&local_410,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)((long)&theta_x + 7));
      pcVar1 = local_18[8];
      local_3f0 = dVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,pcVar1,(allocator<char> *)((long)&theta_y + 7));
      dVar4 = std::__cxx11::stod(&local_440,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)((long)&theta_y + 7));
      pcVar1 = local_18[9];
      local_420 = dVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,pcVar1,(allocator<char> *)((long)&theta_z + 7));
      dVar4 = std::__cxx11::stod(&local_470,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)((long)&theta_z + 7));
      pcVar1 = local_18[10];
      local_450 = dVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,pcVar1,&local_4a1);
      dVar4 = std::__cxx11::stod(&local_4a0,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      local_480 = dVar4;
      std::__cxx11::string::string((string *)&local_4c8,local_70);
      iVar3 = GEO::geofile::import_geofile((geofile *)local_298,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      if (iVar3 == 0) {
        iVar3 = GEO::geofile::rotate_data
                          ((geofile *)local_298,&local_390,&local_3c0,&local_3f0,&local_420,
                           &local_450,&local_480);
        if (iVar3 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,"Rotation completed.",&local_4e9);
          print_ln(&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::allocator<char>::~allocator(&local_4e9);
          std::__cxx11::string::string((string *)&local_510,(string *)local_98);
          iVar3 = GEO::geofile::export_geofile((geofile *)local_298,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          if (iVar3 == 0) {
            std::operator+(&local_530,"File exported as ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
            print_ln(&local_530);
            std::__cxx11::string::~string((string *)&local_530);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_550,"Error: Export failed.",&local_551);
            print_ln(&local_550);
            std::__cxx11::string::~string((string *)&local_550);
            std::allocator<char>::~allocator(&local_551);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"Error: Translation failed.",&local_579);
          print_ln(&local_578);
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator(&local_579);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a0,"Import of geofile failed.",&local_5a1);
        print_ln(&local_5a0);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::allocator<char>::~allocator(&local_5a1);
      }
    }
    GEO::geofile::~geofile((geofile *)local_298);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Error: incorrect argument count.",&local_39);
    print_ln(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void UI::execute_rotate(int &argc, char *argv[])
{
    if (argc!=11)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string input_path   = argv[3];
        std::string outfile_path = argv[4];
        GEO::geofile primary_geofile;
        if ((GEO::is_e_notation(argv[5]))&&
            (GEO::is_e_notation(argv[6]))&&
            (GEO::is_e_notation(argv[7]))&&
            (GEO::is_e_notation(argv[8]))&&
            (GEO::is_e_notation(argv[9]))&&
            (GEO::is_e_notation(argv[10])))
        {
            double ori_x = std::stod(argv[5]);
            double ori_y = std::stod(argv[6]);
            double ori_z = std::stod(argv[7]);
            double theta_x = std::stod(argv[8]);
            double theta_y = std::stod(argv[9]);
            double theta_z = std::stod(argv[10]);
            if(primary_geofile.import_geofile(input_path)==EXIT_SUCCESS)
            {
                if(primary_geofile.rotate_data( ori_x,   ori_y,   ori_z,
                                                theta_x, theta_y, theta_z)==EXIT_SUCCESS)
                {
                    print_ln("Rotation completed.");
                    if(primary_geofile.export_geofile(outfile_path)==EXIT_SUCCESS)
                        print_ln(("File exported as "+outfile_path));
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Translation failed.");
            }
            else
                print_ln("Import of geofile failed.");
        }
        else
            print_ln("Error: Shifting parameters unrecognized. Terminating.");
    }
}